

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O3

Instr decode(u32 pc,u16 code)

{
  undefined2 in_register_00000032;
  Instr IVar1;
  
  IVar1 = (Instr)(*(code *)(&DAT_0010603c +
                           *(int *)(&DAT_0010603c +
                                   (ulong)(CONCAT22(in_register_00000032,code) >> 0xc) * 4)))();
  return IVar1;
}

Assistant:

Instr decode(u32 pc, u16 code) {
  switch (code >> 12) {
    case 0x0:
      // clang-format off
    switch (code & 0xf) {
      case 0x2:
        switch (code & 0xf0) {
          case 0x00: return format_n(code, STC_SR_RN);
          case 0x10: return format_n(code, STC_GBR_RN);
          case 0x20: return format_n(code, STC_VBR_RN);
        }
        break;
      case 0x3:
        switch (code & 0xf0) {
          case 0x00: return format_m(code, BSRF_RM);
          case 0x20: return format_m(code, BRAF_RM);
        }
        break;
      case 0x4: return format_nm(code, MOVB_RM_A_R0_RN);
      case 0x5: return format_nm(code, MOVW_RM_A_R0_RN);
      case 0x6: return format_nm(code, MOVL_RM_A_R0_RN);
      case 0x7: return format_nm(code, MULL_RM_RN);
      case 0x8:
        switch (code) {
          case 0x08: return format_0(CLRT);
          case 0x18: return format_0(SETT);
          case 0x28: return format_0(CLRMAC);
        }
        break;
      case 0x9:
        switch (code & 0xf0) {
          case 0x00: return format_0(NOP);
          case 0x10: return format_0(DIV0U);
          case 0x20: return format_n(code, MOVT_RN);
        }
        break;
      case 0xa:
        switch (code & 0xf0) {
          case 0x00: return format_n(code, STS_MACH_RN);
          case 0x10: return format_n(code, STS_MACL_RN);
          case 0x20: return format_n(code, STS_PR_RN);
        }
        break;
      case 0xb: // RTS SLEEP RTE
        switch (code & 0xf0) {
          case 0x00: return format_0(RTS);
          case 0x10: return format_0(SLEEP);
          case 0x20: return format_0(RTE);
        }
        break;
      case 0xc: return format_nm(code, MOVB_A_R0_RM_RN);
      case 0xd: return format_nm(code, MOVW_A_R0_RM_RN);
      case 0xe: return format_nm(code, MOVL_A_R0_RM_RN);
      case 0xf: return format_nm(code, MACL_ARMP_ARNP);
    }
      // clang-format on
      goto invalid;

    case 0x1:
      return format_nmd(code, MOVL_RM_A_D_RN, 4);

    case 0x2:
      // clang-format off
    switch (code & 0xf) {
      case 0x0: return format_nm(code, MOVB_RM_ARN);
      case 0x1: return format_nm(code, MOVW_RM_ARN);
      case 0x2: return format_nm(code, MOVL_RM_ARN);
      case 0x4: return format_nm(code, MOVB_RM_AMRN);
      case 0x5: return format_nm(code, MOVW_RM_AMRN);
      case 0x6: return format_nm(code, MOVL_RM_AMRN);
      case 0x7: return format_nm(code, DIV0S_RM_RN);
      case 0x8: return format_nm(code, TST_RM_RN);
      case 0x9: return format_nm(code, AND_RM_RN);
      case 0xa: return format_nm(code, XOR_RM_RN);
      case 0xb: return format_nm(code, OR_RM_RN);
      case 0xc: return format_nm(code, CMPSTR_RM_RN);
      case 0xd: return format_nm(code, XTRCT_RM_RN);
      case 0xe: return format_nm(code, MULUW_RM_RN);
      case 0xf: return format_nm(code, MULSW_RM_RN);
    }
      // clang-format on
      goto invalid;

    case 0x3:
      // clang-format off
    switch (code & 0xf) {
      case 0x0: return format_nm(code, CMPEQ_RM_RN);
      case 0x2: return format_nm(code, CMPHS_RM_RN);
      case 0x3: return format_nm(code, CMPGE_RM_RN);
      case 0x4: return format_nm(code, DIV1_RM_RN);
      case 0x5: return format_nm(code, DMULUL_RM_RN);
      case 0x6: return format_nm(code, CMPHI_RM_RN);
      case 0x7: return format_nm(code, CMPGT_RM_RN);
      case 0x8: return format_nm(code, SUB_RM_RN);
      case 0xa: return format_nm(code, SUBC_RM_RN);
      case 0xb: return format_nm(code, SUBV_RM_RN);
      case 0xc: return format_nm(code, ADD_RM_RN);
      case 0xd: return format_nm(code, DMULSL_RM_RN);
      case 0xe: return format_nm(code, ADDC_RM_RN);
      case 0xf: return format_nm(code, ADDV_RM_RN);
    }
      // clang-format on
      goto invalid;

    case 0x4:
      // clang-format off
    switch (code & 0xff) {
      case 0x00: return format_n(code, SHLL_RN);
      case 0x01: return format_n(code, SHLR_RN);
      case 0x02: return format_n(code, STSL_MACH_AMRN);
      case 0x03: return format_n(code, STCL_SR_AMRN);
      case 0x04: return format_n(code, ROTL_RN);
      case 0x05: return format_n(code, ROTR_RN);
      case 0x06: return format_m(code, LDSL_ARMP_MACH);
      case 0x07: return format_m(code, LDSL_ARMP_PR);
      case 0x08: return format_n(code, SHLL2_RN);
      case 0x09: return format_n(code, SHLR2_RN);
      case 0x0a: return format_m(code, LDS_RM_MACH);
      case 0x0b: return format_m(code, JSR_ARM);
      case 0x0e: return format_m(code, LDC_RM_SR);
      case 0x10: return format_n(code, DT_RN);
      case 0x11: return format_n(code, CMPPZ_RN);
      case 0x12: return format_n(code, STSL_MACL_AMRN);
      case 0x13: return format_n(code, STCL_GBR_AMRN);
      case 0x15: return format_n(code, CMPPL_RN);
      case 0x16: return format_m(code, LDSL_ARMP_MACL);
      case 0x17: return format_m(code, LDCL_ARMP_GBR);
      case 0x18: return format_n(code, SHLL8_RN);
      case 0x19: return format_n(code, SHLR8_RN);
      case 0x1a: return format_m(code, LDS_RM_MACL);
      case 0x1b: return format_n(code, TASB_ARN);
      case 0x1e: return format_m(code, LDC_RM_GBR);
      case 0x20: return format_n(code, SHAL_RN);
      case 0x21: return format_n(code, SHAR_RN);
      case 0x22: return format_n(code, STSL_PR_AMRN);
      case 0x23: return format_n(code, STCL_VBR_AMRN);
      case 0x24: return format_n(code, ROTCL_RN);
      case 0x25: return format_n(code, ROTCR_RN);
      case 0x26: return format_m(code, LDSL_ARMP_PR);
      case 0x27: return format_m(code, LDCL_ARMP_VBR);
      case 0x28: return format_n(code, SHLL16_RN);
      case 0x29: return format_n(code, SHLR16_RN);
      case 0x2a: return format_m(code, LDS_RM_PR);
      case 0x2b: return format_m(code, JMP_ARM);
      case 0x2e: return format_m(code, LDC_RM_VBR);

      case 0x0f: case 0x1f: case 0x2f: case 0x3f:
      case 0x4f: case 0x5f: case 0x6f: case 0x7f:
      case 0x8f: case 0x9f: case 0xaf: case 0xbf:
      case 0xcf: case 0xdf: case 0xef: case 0xff:
        return format_nm(code, MACW_ARMP_ARNP);
    }
      // clang-format on
      goto invalid;

    case 0x5:
      return format_nmd(code, MOVL_A_D_RM_RN, 4);

    case 0x6:
      // clang-format off
    switch (code & 0xf) {
      case 0x0: return format_nm(code, MOVB_ARM_RN);
      case 0x1: return format_nm(code, MOVW_ARM_RN);
      case 0x2: return format_nm(code, MOVL_ARM_RN);
      case 0x3: return format_nm(code, MOV_RM_RN);
      case 0x4: return format_nm(code, MOVB_ARMP_RN);
      case 0x5: return format_nm(code, MOVW_ARMP_RN);
      case 0x6: return format_nm(code, MOVL_ARMP_RN);
      case 0x7: return format_nm(code, NOT_RM_RN);
      case 0x8: return format_nm(code, SWAPB_RM_RN);
      case 0x9: return format_nm(code, SWAPW_RM_RN);
      case 0xa: return format_nm(code, NEGC_RM_RN);
      case 0xb: return format_nm(code, NEG_RM_RN);
      case 0xc: return format_nm(code, EXTUB_RM_RN);
      case 0xd: return format_nm(code, EXTUW_RM_RN);
      case 0xe: return format_nm(code, EXTSB_RM_RN);
      case 0xf: return format_nm(code, EXTSW_RM_RN);
    }
      // clang-format on
      goto invalid;

    case 0x7:
      return format_ni(code, ADD_I_RN);

    case 0x8:
      // clang-format off
    switch (code & 0x0f00) {
      case 0x000: return format_nd4(code, MOVB_R0_A_D_RN, 1);
      case 0x100: return format_nd4(code, MOVW_R0_A_D_RN, 2);
      case 0x400: return format_md(code, MOVB_A_D_RM_R0, 1);
      case 0x500: return format_md(code, MOVW_A_D_RM_R0, 2);
      case 0x800: return format_si(code, CMPEQ_I_R0);
      case 0x900: return format_sd(code, BT, pc);
      case 0xb00: return format_sd(code, BF, pc);
      case 0xd00: return format_sd(code, BTS, pc);
      case 0xf00: return format_sd(code, BFS, pc);
    }
      // clang-format on
      goto invalid;

    case 0x9:
      return format_nd8(code, MOVW_A_D_PC_RN, pc, 2);

    case 0xa:
      return format_d12(code, BRA, pc);

    case 0xb:
      return format_d12(code, BSR, pc);

    case 0xc:
      // clang-format off
    switch (code & 0x0f00) {
      case 0x0000: return format_ud(code, MOVB_R0_A_D_GBR, 1);
      case 0x0100: return format_ud(code, MOVW_R0_A_D_GBR, 2);
      case 0x0200: return format_ud(code, MOVL_R0_A_D_GBR, 4);
      case 0x0300: return format_i(code, TRAPA_I);
      case 0x0400: return format_ud(code, MOVB_A_D_GBR_R0, 1);
      case 0x0500: return format_ud(code, MOVW_A_D_GBR_R0, 2);
      case 0x0600: return format_ud(code, MOVL_A_D_GBR_R0, 4);
      case 0x0700: return format_mova(code, MOVA_A_D_PC_R0, pc, 4);
      case 0x0800: return format_i(code, TST_I_R0);
      case 0x0900: return format_i(code, AND_I_R0);
      case 0x0a00: return format_i(code, XOR_I_R0);
      case 0x0b00: return format_i(code, OR_I_R0);
      case 0x0c00: return format_i(code, TSTB_I_A_R0_GBR);
      case 0x0d00: return format_i(code, ANDB_I_A_R0_GBR);
      case 0x0e00: return format_i(code, XORB_I_A_R0_GBR);
      case 0x0f00: return format_i(code, ORB_I_A_R0_GBR);
    }
      // clang-format on
      goto invalid;

    case 0xd:
      return format_nd8(code, MOVL_A_D_PC_RN, pc, 4);

    case 0xe:
      return format_ni(code, MOV_I_RN);

    case 0xf: {
      goto invalid;
    }
  }

  assert(0);
invalid:
  return format_0(INVALID_OP);
}